

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O0

VkFormat vkt::shaderexecutor::anon_unknown_0::getAttributeFormat(DataType dataType)

{
  VkFormat local_c;
  DataType dataType_local;
  
  switch(dataType) {
  case TYPE_FLOAT:
    local_c = VK_FORMAT_R32_SFLOAT;
    break;
  case TYPE_FLOAT_VEC2:
    local_c = VK_FORMAT_R32G32_SFLOAT;
    break;
  case TYPE_FLOAT_VEC3:
    local_c = VK_FORMAT_R32G32B32_SFLOAT;
    break;
  case TYPE_FLOAT_VEC4:
    local_c = VK_FORMAT_R32G32B32A32_SFLOAT;
    break;
  case TYPE_FLOAT_MAT2:
    local_c = VK_FORMAT_R32G32_SFLOAT;
    break;
  case TYPE_FLOAT_MAT2X3:
    local_c = VK_FORMAT_R32G32B32_SFLOAT;
    break;
  case TYPE_FLOAT_MAT2X4:
    local_c = VK_FORMAT_R32G32B32A32_SFLOAT;
    break;
  case TYPE_FLOAT_MAT3X2:
    local_c = VK_FORMAT_R32G32_SFLOAT;
    break;
  case TYPE_FLOAT_MAT3:
    local_c = VK_FORMAT_R32G32B32_SFLOAT;
    break;
  case TYPE_FLOAT_MAT3X4:
    local_c = VK_FORMAT_R32G32B32A32_SFLOAT;
    break;
  case TYPE_FLOAT_MAT4X2:
    local_c = VK_FORMAT_R32G32_SFLOAT;
    break;
  case TYPE_FLOAT_MAT4X3:
    local_c = VK_FORMAT_R32G32B32_SFLOAT;
    break;
  case TYPE_FLOAT_MAT4:
    local_c = VK_FORMAT_R32G32B32A32_SFLOAT;
    break;
  default:
    local_c = VK_FORMAT_UNDEFINED;
    break;
  case TYPE_INT:
    local_c = VK_FORMAT_R32_SINT;
    break;
  case TYPE_INT_VEC2:
    local_c = VK_FORMAT_R32G32_SINT;
    break;
  case TYPE_INT_VEC3:
    local_c = VK_FORMAT_R32G32B32_SINT;
    break;
  case TYPE_INT_VEC4:
    local_c = VK_FORMAT_R32G32B32A32_SINT;
    break;
  case TYPE_UINT:
    local_c = VK_FORMAT_R32_UINT;
    break;
  case TYPE_UINT_VEC2:
    local_c = VK_FORMAT_R32G32_UINT;
    break;
  case TYPE_UINT_VEC3:
    local_c = VK_FORMAT_R32G32B32_UINT;
    break;
  case TYPE_UINT_VEC4:
    local_c = VK_FORMAT_R32G32B32A32_UINT;
  }
  return local_c;
}

Assistant:

static VkFormat getAttributeFormat (const glu::DataType dataType)
{
	switch (dataType)
	{
		case glu::TYPE_FLOAT:			return VK_FORMAT_R32_SFLOAT;
		case glu::TYPE_FLOAT_VEC2:		return VK_FORMAT_R32G32_SFLOAT;
		case glu::TYPE_FLOAT_VEC3:		return VK_FORMAT_R32G32B32_SFLOAT;
		case glu::TYPE_FLOAT_VEC4:		return VK_FORMAT_R32G32B32A32_SFLOAT;

		case glu::TYPE_INT:				return VK_FORMAT_R32_SINT;
		case glu::TYPE_INT_VEC2:		return VK_FORMAT_R32G32_SINT;
		case glu::TYPE_INT_VEC3:		return VK_FORMAT_R32G32B32_SINT;
		case glu::TYPE_INT_VEC4:		return VK_FORMAT_R32G32B32A32_SINT;

		case glu::TYPE_UINT:			return VK_FORMAT_R32_UINT;
		case glu::TYPE_UINT_VEC2:		return VK_FORMAT_R32G32_UINT;
		case glu::TYPE_UINT_VEC3:		return VK_FORMAT_R32G32B32_UINT;
		case glu::TYPE_UINT_VEC4:		return VK_FORMAT_R32G32B32A32_UINT;

		case glu::TYPE_FLOAT_MAT2:		return VK_FORMAT_R32G32_SFLOAT;
		case glu::TYPE_FLOAT_MAT2X3:	return VK_FORMAT_R32G32B32_SFLOAT;
		case glu::TYPE_FLOAT_MAT2X4:	return VK_FORMAT_R32G32B32A32_SFLOAT;
		case glu::TYPE_FLOAT_MAT3X2:	return VK_FORMAT_R32G32_SFLOAT;
		case glu::TYPE_FLOAT_MAT3:		return VK_FORMAT_R32G32B32_SFLOAT;
		case glu::TYPE_FLOAT_MAT3X4:	return VK_FORMAT_R32G32B32A32_SFLOAT;
		case glu::TYPE_FLOAT_MAT4X2:	return VK_FORMAT_R32G32_SFLOAT;
		case glu::TYPE_FLOAT_MAT4X3:	return VK_FORMAT_R32G32B32_SFLOAT;
		case glu::TYPE_FLOAT_MAT4:		return VK_FORMAT_R32G32B32A32_SFLOAT;
		default:
			DE_ASSERT(false);
			return VK_FORMAT_UNDEFINED;
	}
}